

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11.c
# Opt level: O0

void platform_get_x11_auth(X11Display *disp,Conf *conf)

{
  bool bVar1;
  char *pcStack_20;
  _Bool needs_free;
  char *xauthfile;
  Conf *conf_local;
  X11Display *disp_local;
  
  bVar1 = false;
  pcStack_20 = getenv("XAUTHORITY");
  if (pcStack_20 == (char *)0x0) {
    pcStack_20 = getenv("HOME");
    bVar1 = pcStack_20 != (char *)0x0;
    if (bVar1) {
      pcStack_20 = dupcat_fn(pcStack_20,"/.Xauthority",0);
    }
  }
  if ((pcStack_20 != (char *)0x0) && (x11_get_auth_from_authfile(disp,pcStack_20), bVar1)) {
    safefree(pcStack_20);
  }
  return;
}

Assistant:

void platform_get_x11_auth(struct X11Display *disp, Conf *conf)
{
    char *xauthfile;
    bool needs_free;

    /*
     * Find the .Xauthority file.
     */
    needs_free = false;
    xauthfile = getenv("XAUTHORITY");
    if (!xauthfile) {
        xauthfile = getenv("HOME");
        if (xauthfile) {
            xauthfile = dupcat(xauthfile, "/.Xauthority");
            needs_free = true;
        }
    }

    if (xauthfile) {
        x11_get_auth_from_authfile(disp, xauthfile);
        if (needs_free)
            sfree(xauthfile);
    }
}